

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::calcNdfRaw(SimInfo *this)

{
  bool bVar1;
  StuntDouble *this_00;
  long in_RDI;
  StuntDouble *sd;
  Molecule *mol;
  iterator j;
  MoleculeIterator i;
  int ndfRaw_local;
  Molecule *local_28;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> in_stack_ffffffffffffffe8;
  uint in_stack_fffffffffffffff0;
  int iVar2;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)
             &stack0xffffffffffffffe8);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_20);
  iVar2 = 0;
  local_28 = beginMolecule((SimInfo *)(ulong)in_stack_fffffffffffffff0,
                           (MoleculeIterator *)in_stack_ffffffffffffffe8._M_node);
  while (local_28 != (Molecule *)0x0) {
    this_00 = Molecule::beginIntegrableObject
                        ((Molecule *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                         (iterator *)in_stack_ffffffffffffffe8._M_node);
    while (this_00 != (StuntDouble *)0x0) {
      iVar2 = iVar2 + 3;
      bVar1 = StuntDouble::isDirectional(this_00);
      if (bVar1) {
        bVar1 = StuntDouble::isLinear(this_00);
        if (bVar1) {
          iVar2 = iVar2 + 2;
        }
        else {
          iVar2 = iVar2 + 3;
        }
      }
      this_00 = Molecule::nextIntegrableObject
                          ((Molecule *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                           (iterator *)in_stack_ffffffffffffffe8._M_node);
    }
    local_28 = nextMolecule((SimInfo *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                            (MoleculeIterator *)in_stack_ffffffffffffffe8._M_node);
  }
  *(int *)(in_RDI + 0x90) = iVar2;
  return;
}

Assistant:

void SimInfo::calcNdfRaw() {
    int ndfRaw_local;

    MoleculeIterator i;
    vector<StuntDouble*>::iterator j;
    Molecule* mol;
    StuntDouble* sd;

    // Raw degrees of freedom that we have to set
    ndfRaw_local = 0;

    for (mol = beginMolecule(i); mol != NULL; mol = nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndfRaw_local += 3;

        if (sd->isDirectional()) {
          if (sd->isLinear()) {
            ndfRaw_local += 2;
          } else {
            ndfRaw_local += 3;
          }
        }
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(&ndfRaw_local, &ndfRaw_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#else
    ndfRaw_                    = ndfRaw_local;
#endif
  }